

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall
miniros::Connection::setHeaderReceivedCallback(Connection *this,HeaderReceivedFunc *func)

{
  int iVar1;
  size_t in_RCX;
  Connection *local_28;
  undefined8 local_20;
  code *local_18;
  code *local_10;
  
  std::function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>::
  operator=(&this->header_func_,func);
  iVar1 = (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Transport[0xb])();
  if ((char)iVar1 != '\0') {
    local_20 = 0;
    local_10 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:490:19)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/connection.cpp:490:19)>
               ::_M_manager;
    local_28 = this;
    read(this,4,&local_28,in_RCX);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,3);
    }
  }
  return;
}

Assistant:

void Connection::setHeaderReceivedCallback(const HeaderReceivedFunc& func)
{
  header_func_ = func;

  if (transport_->requiresHeader())
  {
    auto wrapFn = [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
    {
      this->onHeaderLengthRead(conn, buffer, size, success);
    };
    read(4, wrapFn);
  }
}